

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

int xmlRelaxNGValidateAttributeList
              (xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict defines)

{
  bool bVar1;
  int iVar2;
  xmlRelaxNGDefinePtr_conflict local_38;
  xmlRelaxNGDefinePtr_conflict cur;
  int needmore;
  int res;
  int ret;
  xmlRelaxNGDefinePtr_conflict defines_local;
  xmlRelaxNGValidCtxtPtr ctxt_local;
  
  needmore = 0;
  bVar1 = false;
  for (local_38 = defines; local_38 != (xmlRelaxNGDefinePtr_conflict)0x0; local_38 = local_38->next)
  {
    if (local_38->type == XML_RELAXNG_ATTRIBUTE) {
      iVar2 = xmlRelaxNGValidateAttribute(ctxt,local_38);
      if (iVar2 != 0) {
        needmore = -1;
      }
    }
    else {
      bVar1 = true;
    }
  }
  local_38 = defines;
  if (bVar1) {
    for (; local_38 != (xmlRelaxNGDefinePtr_conflict)0x0; local_38 = local_38->next) {
      if (local_38->type != XML_RELAXNG_ATTRIBUTE) {
        if ((ctxt->state == (xmlRelaxNGValidStatePtr)0x0) &&
           (ctxt->states == (xmlRelaxNGStatesPtr)0x0)) {
          xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_NOSTATE,(xmlChar *)0x0,(xmlChar *)0x0,0);
          return -1;
        }
        iVar2 = xmlRelaxNGValidateDefinition(ctxt,local_38);
        if (iVar2 < 0) {
          needmore = -1;
        }
        if (iVar2 == -1) break;
      }
    }
    ctxt_local._4_4_ = needmore;
  }
  else {
    ctxt_local._4_4_ = needmore;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlRelaxNGValidateAttributeList(xmlRelaxNGValidCtxtPtr ctxt,
                                xmlRelaxNGDefinePtr defines)
{
    int ret = 0, res;
    int needmore = 0;
    xmlRelaxNGDefinePtr cur;

    cur = defines;
    while (cur != NULL) {
        if (cur->type == XML_RELAXNG_ATTRIBUTE) {
            if (xmlRelaxNGValidateAttribute(ctxt, cur) != 0)
                ret = -1;
        } else
            needmore = 1;
        cur = cur->next;
    }
    if (!needmore)
        return (ret);
    cur = defines;
    while (cur != NULL) {
        if (cur->type != XML_RELAXNG_ATTRIBUTE) {
            if ((ctxt->state != NULL) || (ctxt->states != NULL)) {
                res = xmlRelaxNGValidateDefinition(ctxt, cur);
                if (res < 0)
                    ret = -1;
            } else {
                VALID_ERR(XML_RELAXNG_ERR_NOSTATE);
                return (-1);
            }
            if (res == -1)      /* continues on -2 */
                break;
        }
        cur = cur->next;
    }

    return (ret);
}